

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int *x;
  int *piVar2;
  int k;
  vector<int,_std::allocator<int>_> r;
  priority_queue<int,_std::less<int>_> pq;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x106198) = 0;
  pq.mData = (int *)operator_new__(4);
  *pq.mData = 0;
  pq.mCap = 1;
  pq.mSize = 0;
  std::istream::operator>>((istream *)&std::cin,&k);
  for (r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
       _0_4_ = 0;
      (int)r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      < 10; r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            ._0_4_ = (int)r.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1) {
    CP::priority_queue<int,_std::less<int>_>::push(&pq,(int *)&r);
  }
  CP::priority_queue<int,_std::less<int>_>::at_level(&r,&pq,(long)k);
  poVar1 = std::operator<<((ostream *)&std::cout,"size = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (piVar2 = (int *)CONCAT44(r.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)r.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      piVar2 != r.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish; piVar2 = piVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&r.super__Vector_base<int,_std::allocator<int>_>);
  CP::priority_queue<int,_std::less<int>_>::~priority_queue(&pq);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false); cin.tie(NULL);

  CP::priority_queue<int> pq;

  int n,k;
  n = 10;
  cin >> k;
//  cin >> n >> k;
//  while(n--) {
//    int x;
//    cin >> x;
//    pq.push(x);
//  }
  for (int i = 0; i < 10; ++i) {
      pq.push(i);
  }

  std::vector<int> r = pq.at_level(k);
  cout << "size = " << r.size() << endl;
  for (auto &x : r) {
    cout << x << " ";
  }
  cout << endl;

}